

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lex_newline(LexState *ls)

{
  byte *pbVar1;
  int iVar2;
  uint local_2c;
  uint local_28;
  LexChar old;
  LexState *ls_local;
  
  iVar2 = ls->c;
  if (ls->p < ls->pe) {
    pbVar1 = (byte *)ls->p;
    ls->p = (char *)(pbVar1 + 1);
    local_28 = (uint)*pbVar1;
  }
  else {
    local_28 = lex_more(ls);
  }
  ls->c = local_28;
  if (((ls->c == 10) || (ls->c == 0xd)) && (ls->c != iVar2)) {
    if (ls->p < ls->pe) {
      pbVar1 = (byte *)ls->p;
      ls->p = (char *)(pbVar1 + 1);
      local_2c = (uint)*pbVar1;
    }
    else {
      local_2c = lex_more(ls);
    }
    ls->c = local_2c;
  }
  iVar2 = ls->linenumber + 1;
  ls->linenumber = iVar2;
  if (0x7ffffeff < iVar2) {
    lj_lex_error(ls,ls->tok,LJ_ERR_XLINES);
  }
  return;
}

Assistant:

static void lex_newline(LexState *ls)
{
  LexChar old = ls->c;
  lj_assertLS(lex_iseol(ls), "bad usage");
  lex_next(ls);  /* Skip "\n" or "\r". */
  if (lex_iseol(ls) && ls->c != old) lex_next(ls);  /* Skip "\n\r" or "\r\n". */
  if (++ls->linenumber >= LJ_MAX_LINE)
    lj_lex_error(ls, ls->tok, LJ_ERR_XLINES);
}